

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_int_C.c
# Opt level: O0

int test_int_C(void)

{
  int iVar1;
  uint local_c;
  
  iVar1 = test_int_format();
  local_c = (uint)(iVar1 != 0);
  return local_c;
}

Assistant:

int test_int_C(void)
{
  if(!test_int_format())
    {
    return 0;
    }
  return 1;
}